

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_lower(lua_State *L)

{
  char *pcVar1;
  char *pcVar2;
  __int32_t **pp_Var3;
  ulong uVar4;
  size_t l;
  luaL_Buffer b;
  
  pcVar1 = luaL_checklstring(L,1,&l);
  pcVar2 = luaL_buffinitsize(L,&b,l);
  for (uVar4 = 0; uVar4 < l; uVar4 = uVar4 + 1) {
    pp_Var3 = __ctype_tolower_loc();
    pcVar2[uVar4] = (char)(*pp_Var3)[(byte)pcVar1[uVar4]];
  }
  luaL_pushresultsize(&b,l);
  return 1;
}

Assistant:

static int str_lower(lua_State *L) {
    size_t l;
    size_t i;
    luaL_Buffer b;
    const char *s = luaL_checklstring(L, 1, &l);
    char *p = luaL_buffinitsize(L, &b, l);
    for (i = 0; i < l; i++)
        p[i] = tolower(uchar(s[i]));
    luaL_pushresultsize(&b, l);
    return 1;
}